

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O3

size_t VW_HashFeatureStaticA(char *s,unsigned_long u,char *h,uint num_bits)

{
  char *pcVar1;
  hash_func_t p_Var2;
  uint64_t uVar3;
  substring sVar4;
  string hash;
  string str;
  allocator local_b1;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  std::__cxx11::string::string((string *)&local_50,s,(allocator *)&local_90);
  std::__cxx11::string::string((string *)&local_90,h,&local_b1);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_50,local_50 + local_48);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
  pcVar1 = local_b0;
  p_Var2 = getHasher(&local_70);
  sVar4.end = pcVar1 + local_a8;
  sVar4.begin = pcVar1;
  uVar3 = (*p_Var2)(sVar4,u);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return (ulong)((uint)uVar3 & ~(-1 << ((byte)num_bits & 0x1f)));
}

Assistant:

VW_DLL_MEMBER size_t VW_CALLING_CONV VW_HashFeatureStaticA(const char * s, unsigned long u, const char * h = "strings", unsigned int num_bits = 18)
{ string str(s);
  string hash(h);
  return VW::hash_feature_static(str, u, hash, num_bits);
}